

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O0

void helper_gvec_sshl_b_arm(void *vd,void *vn,void *vm,uint32_t desc)

{
  uintptr_t opr_sz_00;
  uintptr_t max_sz;
  undefined1 local_5c;
  undefined1 local_53;
  int8_t res;
  int8_t nn;
  int8_t mm;
  int8_t *m;
  int8_t *n;
  int8_t *d;
  intptr_t opr_sz;
  intptr_t i;
  uint32_t desc_local;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  opr_sz_00 = simd_oprsz(desc);
  for (opr_sz = 0; opr_sz < (long)opr_sz_00; opr_sz = opr_sz + 1) {
    local_5c = *(byte *)((long)vm + opr_sz);
    local_53 = 0;
    if ((char)local_5c < '\0') {
      if ((char)local_5c < -7) {
        local_5c = 7;
      }
      else {
        local_5c = -local_5c;
      }
      local_53 = (undefined1)((int)*(char *)((long)vn + opr_sz) >> (local_5c & 0x1f));
    }
    else if ((char)local_5c < '\b') {
      local_53 = (undefined1)((int)*(char *)((long)vn + opr_sz) << (local_5c & 0x1f));
    }
    *(undefined1 *)((long)vd + opr_sz) = local_53;
  }
  max_sz = simd_maxsz(desc);
  clear_tail(vd,opr_sz_00,max_sz);
  return;
}

Assistant:

void HELPER(gvec_sshl_b)(void *vd, void *vn, void *vm, uint32_t desc)
{
    intptr_t i, opr_sz = simd_oprsz(desc);
    int8_t *d = vd, *n = vn, *m = vm;

    for (i = 0; i < opr_sz; ++i) {
        int8_t mm = m[i];
        int8_t nn = n[i];
        int8_t res = 0;
        if (mm >= 0) {
            if (mm < 8) {
                res = nn << mm;
            }
        } else {
            res = nn >> (mm > -8 ? -mm : 7);
        }
        d[i] = res;
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}